

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_test_connection.c
# Opt level: O0

apx_clientTestConnection_t * apx_clientTestConnection_new(void)

{
  apx_error_t aVar1;
  apx_clientTestConnection_t *paStack_10;
  apx_error_t result;
  apx_clientTestConnection_t *self;
  
  paStack_10 = (apx_clientTestConnection_t *)malloc(0x5d0);
  if ((paStack_10 != (apx_clientTestConnection_t *)0x0) &&
     (aVar1 = apx_clientTestConnection_create(paStack_10), aVar1 != 0)) {
    free(paStack_10);
    paStack_10 = (apx_clientTestConnection_t *)0x0;
  }
  return paStack_10;
}

Assistant:

apx_clientTestConnection_t *apx_clientTestConnection_new(void)
{
   apx_clientTestConnection_t *self = (apx_clientTestConnection_t*) malloc(sizeof(apx_clientTestConnection_t));
   if (self != NULL)
   {
      apx_error_t result = apx_clientTestConnection_create(self);
      if (result != APX_NO_ERROR)
      {
         free(self);
         self = 0;
      }
   }
   return self;
}